

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btSoftBody::Node_*>::push_back
          (btAlignedObjectArray<btSoftBody::Node_*> *this,Node **_Val)

{
  int iVar1;
  int iVar2;
  btAlignedObjectArray<btSoftBody::Node_*> *in_RSI;
  btAlignedObjectArray<btSoftBody::Node_*> *in_RDI;
  int sz;
  int _Count;
  
  iVar1 = size(in_RDI);
  _Count = iVar1;
  iVar2 = capacity(in_RDI);
  if (iVar1 == iVar2) {
    iVar1 = size(in_RDI);
    allocSize(in_RDI,iVar1);
    reserve(in_RSI,_Count);
  }
  in_RDI->m_data[in_RDI->m_size] = *(Node **)in_RSI;
  in_RDI->m_size = in_RDI->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}